

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TestPartResult *pTVar4;
  ostream *poVar5;
  internal *piVar6;
  char *pcVar7;
  size_t in_RDX;
  size_t width;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string message_1;
  string location_1;
  TestPartResult *part_1;
  int i_1;
  int skipped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string kIndent;
  TestResult *result_local;
  ostream *stream_local;
  
  kIndent.field_2._8_8_ = result;
  Indent_abi_cxx11_((string *)&i,(internal *)0xa,in_RDX);
  part._4_4_ = 0;
  for (part._0_4_ = 0; iVar2 = TestResult::total_part_count((TestResult *)kIndent.field_2._8_8_),
      (int)part < iVar2; part._0_4_ = (int)part + 1) {
    pTVar4 = TestResult::GetTestPartResult((TestResult *)kIndent.field_2._8_8_,(int)part);
    bVar1 = TestPartResult::failed(pTVar4);
    if (bVar1) {
      std::operator<<(stream,",\n");
      part._4_4_ = part._4_4_ + 1;
      if (part._4_4_ == 1) {
        poVar5 = std::operator<<(stream,(string *)&i);
        poVar5 = std::operator<<(poVar5,"\"");
        poVar5 = std::operator<<(poVar5,"failures");
        std::operator<<(poVar5,"\": [\n");
      }
      piVar6 = (internal *)TestPartResult::file_name(pTVar4);
      uVar3 = TestPartResult::line_number(pTVar4);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((string *)((long)&message.field_2 + 8),piVar6,(char *)(ulong)uVar3,iVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&message.field_2 + 8),"\n");
      pcVar7 = TestPartResult::message(pTVar4);
      std::operator+(&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                     pcVar7);
      EscapeJson((string *)local_88,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&i_1);
      poVar5 = std::operator<<(stream,(string *)&i);
      poVar5 = std::operator<<(poVar5,"  {\n");
      poVar5 = std::operator<<(poVar5,(string *)&i);
      poVar5 = std::operator<<(poVar5,"    \"failure\": \"");
      poVar5 = std::operator<<(poVar5,(string *)local_88);
      poVar5 = std::operator<<(poVar5,"\",\n");
      poVar5 = std::operator<<(poVar5,(string *)&i);
      poVar5 = std::operator<<(poVar5,"    \"type\": \"\"\n");
      poVar5 = std::operator<<(poVar5,(string *)&i);
      std::operator<<(poVar5,"  }");
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    }
  }
  if (0 < part._4_4_) {
    poVar5 = std::operator<<(stream,"\n");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    std::operator<<(poVar5,"]");
  }
  part_1._4_4_ = 0;
  for (part_1._0_4_ = 0; iVar2 = TestResult::total_part_count((TestResult *)kIndent.field_2._8_8_),
      (int)part_1 < iVar2; part_1._0_4_ = (int)part_1 + 1) {
    pTVar4 = TestResult::GetTestPartResult((TestResult *)kIndent.field_2._8_8_,(int)part_1);
    bVar1 = TestPartResult::skipped(pTVar4);
    if (bVar1) {
      std::operator<<(stream,",\n");
      part_1._4_4_ = part_1._4_4_ + 1;
      if (part_1._4_4_ == 1) {
        poVar5 = std::operator<<(stream,(string *)&i);
        poVar5 = std::operator<<(poVar5,"\"");
        poVar5 = std::operator<<(poVar5,"skipped");
        std::operator<<(poVar5,"\": [\n");
      }
      piVar6 = (internal *)TestPartResult::file_name(pTVar4);
      uVar3 = TestPartResult::line_number(pTVar4);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((string *)((long)&message_1.field_2 + 8),piVar6,(char *)(ulong)uVar3,iVar2);
      std::operator+(&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&message_1.field_2 + 8),"\n");
      pcVar7 = TestPartResult::message(pTVar4);
      std::operator+(&local_138,&local_158,pcVar7);
      EscapeJson((string *)local_118,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      poVar5 = std::operator<<(stream,(string *)&i);
      poVar5 = std::operator<<(poVar5,"  {\n");
      poVar5 = std::operator<<(poVar5,(string *)&i);
      poVar5 = std::operator<<(poVar5,"    \"message\": \"");
      poVar5 = std::operator<<(poVar5,(string *)local_118);
      poVar5 = std::operator<<(poVar5,"\"\n");
      poVar5 = std::operator<<(poVar5,(string *)&i);
      std::operator<<(poVar5,"  }");
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::string::~string((string *)(message_1.field_2._M_local_buf + 8));
    }
  }
  if (0 < part_1._4_4_) {
    poVar5 = std::operator<<(stream,"\n");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    std::operator<<(poVar5,"]");
  }
  poVar5 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&local_178,(internal *)0x8,width);
  poVar5 = std::operator<<(poVar5,(string *)&local_178);
  std::operator<<(poVar5,"}");
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  {
    int failures = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.failed()) {
        *stream << ",\n";
        if (++failures == 1) {
          *stream << kIndent << "\"" << "failures" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"failure\": \"" << message << "\",\n"
                << kIndent << "    \"type\": \"\"\n"
                << kIndent << "  }";
      }
    }

    if (failures > 0) *stream << "\n" << kIndent << "]";
  }

  {
    int skipped = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.skipped()) {
        *stream << ",\n";
        if (++skipped == 1) {
          *stream << kIndent << "\"" << "skipped" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"message\": \"" << message << "\"\n"
                << kIndent << "  }";
      }
    }

    if (skipped > 0) *stream << "\n" << kIndent << "]";
  }

  *stream << "\n" << Indent(8) << "}";
}